

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12_string_object.cpp
# Opt level: O0

int input_and_output_lines(void)

{
  code *pcVar1;
  ostream *poVar2;
  string *local_c0;
  int local_b8;
  int i;
  string local_a8 [5];
  
  local_c0 = local_a8;
  do {
    std::__cxx11::string::string((string *)local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 != (string *)&stack0xfffffffffffffff8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Enter your ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
  std::operator<<(poVar2," favorite fruit name: \n");
  for (local_b8 = 0; local_b8 < 5; local_b8 = local_b8 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_b8 + 1);
    std::operator<<(poVar2," :");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)(local_a8 + local_b8));
  }
  std::operator<<((ostream *)&std::cout,"Here\'s what you input:\n");
  display_all_strings(local_a8,5);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int input_and_output_lines () {
    using namespace std;
    string list[SIZE];
    cout << "Enter your " << SIZE << " favorite fruit name: \n";
    for (int i = 0; i < SIZE; i++) {
        cout << i + 1 << " :";
        //  从输入流 CIN 中取一行，写入字符串地址
        getline(cin, list[i]);
    }
    cout << "Here's what you input:\n";
    display_all_strings(list, SIZE);
}